

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

void __thiscall aim_t::EnterLinePortal(aim_t *this,line_t *li,double frac)

{
  subsector_t *psVar1;
  FLinePortal *pFVar2;
  aim_t newtrace;
  aim_t local_150;
  
  local_150.aimtrace.X = (this->aimtrace).X;
  local_150.aimpitch.Degrees = (this->aimpitch).Degrees;
  local_150.aimtarget = this->aimtarget;
  local_150.attackrange = this->attackrange;
  local_150.shootthing = this->shootthing;
  local_150.friender = this->friender;
  local_150.shootz = this->shootz;
  local_150.flags = this->flags;
  pFVar2 = (FLinePortal *)0x0;
  if (li->portalindex < linePortals.Count) {
    pFVar2 = linePortals.Array + li->portalindex;
  }
  if ((local_150.flags & 0x20U) == 0 || pFVar2->mType == '\x03') {
    local_150.toppitch.Degrees = (this->toppitch).Degrees;
    local_150.bottompitch.Degrees = (this->bottompitch).Degrees;
    local_150.aimdir = this->aimdir;
    local_150.unlinked = pFVar2->mType != '\x03';
    local_150.startpos.Z = (this->startpos).Z;
    local_150.startpos.Y = (this->startpos).Y;
    local_150.startpos.X = (this->startpos).X;
    local_150.aimtrace.Y = (this->aimtrace).Y;
    P_TranslatePortalXY(li,&local_150.startpos.X,&local_150.startpos.Y);
    P_TranslatePortalZ(li,&local_150.startpos.Z);
    P_TranslatePortalVXVY(li,&local_150.aimtrace.X,&local_150.aimtrace.Y);
    local_150.startfrac = 1.0 / this->attackrange + frac;
    psVar1 = P_PointInSubsector(local_150.aimtrace.X * local_150.startfrac + local_150.startpos.X,
                                local_150.startfrac * local_150.aimtrace.Y + local_150.startpos.Y);
    local_150.lastsector = psVar1->sector;
    P_TranslatePortalZ(li,&this->limitz);
    if (aimdebug.Value == true) {
      Printf("-----Entering line portal from sector %d to sector %d\n",
             (ulong)(uint)this->lastsector->sectornum,(ulong)(uint)(local_150.lastsector)->sectornum
            );
    }
    AimTraverse(&local_150);
    if (local_150.linetarget.frac < (this->linetarget).frac) {
      (this->linetarget).super_FTranslatedLineTarget.linetarget =
           local_150.linetarget.super_FTranslatedLineTarget.linetarget;
      (this->linetarget).super_FTranslatedLineTarget.angleFromSource.Degrees =
           local_150.linetarget.super_FTranslatedLineTarget.angleFromSource.Degrees;
      (this->linetarget).super_FTranslatedLineTarget.unlinked =
           local_150.linetarget.super_FTranslatedLineTarget.unlinked;
      (this->linetarget).pitch.Degrees = local_150.linetarget.pitch.Degrees;
      (this->linetarget).frac = local_150.linetarget.frac;
    }
    if (local_150.thing_friend.frac < (this->thing_friend).frac) {
      (this->thing_friend).super_FTranslatedLineTarget.linetarget =
           local_150.thing_friend.super_FTranslatedLineTarget.linetarget;
      (this->thing_friend).super_FTranslatedLineTarget.angleFromSource.Degrees =
           local_150.thing_friend.super_FTranslatedLineTarget.angleFromSource.Degrees;
      (this->thing_friend).super_FTranslatedLineTarget.unlinked =
           local_150.thing_friend.super_FTranslatedLineTarget.unlinked;
      (this->thing_friend).pitch.Degrees = local_150.thing_friend.pitch.Degrees;
      (this->thing_friend).frac = local_150.thing_friend.frac;
    }
    if (local_150.thing_other.frac < (this->thing_other).frac) {
      (this->thing_other).super_FTranslatedLineTarget.linetarget =
           local_150.thing_other.super_FTranslatedLineTarget.linetarget;
      (this->thing_other).super_FTranslatedLineTarget.angleFromSource.Degrees =
           local_150.thing_other.super_FTranslatedLineTarget.angleFromSource.Degrees;
      (this->thing_other).super_FTranslatedLineTarget.unlinked =
           local_150.thing_other.super_FTranslatedLineTarget.unlinked;
      (this->thing_other).pitch.Degrees = local_150.thing_other.pitch.Degrees;
      (this->thing_other).frac = local_150.thing_other.frac;
    }
  }
  return;
}

Assistant:

void EnterLinePortal(line_t *li, double frac)
	{
		aim_t newtrace = Clone();

		FLinePortal *port = li->getPortal();
		if (port->mType != PORTT_LINKED && (flags & ALF_PORTALRESTRICT)) return;

		newtrace.toppitch = toppitch;
		newtrace.bottompitch = bottompitch;
		newtrace.aimdir = aimdir;
		newtrace.unlinked = (port->mType != PORTT_LINKED);
		newtrace.startpos = startpos;
		newtrace.aimtrace = aimtrace;
		P_TranslatePortalXY(li, newtrace.startpos.X, newtrace.startpos.Y);
		P_TranslatePortalZ(li, newtrace.startpos.Z);
		P_TranslatePortalVXVY(li, newtrace.aimtrace.X, newtrace.aimtrace.Y);

		newtrace.startfrac = frac + 1 / attackrange;	// this is to skip the transition line to the portal which would produce a bogus opening

		DVector2 pos = newtrace.startpos + newtrace.aimtrace * newtrace.startfrac;

		newtrace.lastsector = P_PointInSector(pos);
		P_TranslatePortalZ(li, limitz);
		if (aimdebug)
			Printf("-----Entering line portal from sector %d to sector %d\n", lastsector->sectornum, newtrace.lastsector->sectornum);
		newtrace.AimTraverse();
		SetResult(linetarget, newtrace.linetarget);
		SetResult(thing_friend, newtrace.thing_friend);
		SetResult(thing_other, newtrace.thing_other);
	}